

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O2

Bounds string2bounds(string *boundString)

{
  char *__nptr;
  int iVar1;
  int iVar2;
  int iVar4;
  Bounds BVar5;
  allocator local_41;
  char *t_1;
  char *t;
  long lVar3;
  
  __nptr = (boundString->_M_dataplus)._M_p;
  if (*__nptr == ':') {
    std::__cxx11::string::substr((ulong)&t_1,(ulong)boundString);
    std::__cxx11::string::operator=((string *)boundString,(string *)&t_1);
    std::__cxx11::string::~string((string *)&t_1);
    iVar4 = 0;
  }
  else {
    lVar3 = strtol(__nptr,&t,10);
    std::__cxx11::string::string((string *)&t_1,t,&local_41);
    std::__cxx11::string::operator=((string *)boundString,(string *)&t_1);
    std::__cxx11::string::~string((string *)&t_1);
    iVar4 = (int)lVar3;
    iVar2 = iVar4;
    if (boundString->_M_string_length == 0) goto LAB_00118c05;
    std::__cxx11::string::substr((ulong)&t_1,(ulong)boundString);
    std::__cxx11::string::operator=((string *)boundString,(string *)&t_1);
    std::__cxx11::string::~string((string *)&t_1);
  }
  iVar2 = 0x7fffffff;
LAB_00118c05:
  if (boundString->_M_string_length != 0) {
    lVar3 = strtol((boundString->_M_dataplus)._M_p,&t_1,10);
    iVar2 = (int)lVar3;
  }
  iVar1 = iVar4;
  if (iVar4 < iVar2) {
    iVar1 = iVar2;
  }
  if (iVar2 < iVar4) {
    iVar4 = iVar2;
  }
  BVar5.upper = iVar1;
  BVar5.lower = iVar4;
  return BVar5;
}

Assistant:

Bounds string2bounds(std::string boundString)
{
	Bounds bounds = { 0, std::numeric_limits<int>::max() };

	if (boundString[0] != ':')
	{
		const char *s = boundString.c_str();
		char *t;
		bounds.lower = strtol(s, &t, 10);
		boundString = std::string(t);
		if (boundString.length() == 0)
		{
			bounds.upper = bounds.lower;
		}
		else
		{
			boundString = boundString.substr(1);
		}
	}
	else
	{
		boundString = boundString.substr(1);
	}

	if (boundString.length() > 0)
	{
		const char *s = boundString.c_str();
		char *t;
		bounds.upper = strtol(s, &t, 10);
	}

	if (bounds.upper < bounds.lower)
	{
		std::swap(bounds.upper, bounds.lower);
	}

	return bounds;
}